

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BronKerbosch.cpp
# Opt level: O1

bool __thiscall
BronKerbosch::cliquesistent
          (BronKerbosch *this,alignment_set_t *R,alignment_set_t *P,alignment_set_t *X)

{
  ulong *puVar1;
  ulong uVar2;
  size_type sVar3;
  ulong uVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  BronKerbosch *pBVar9;
  BronKerbosch *this_00;
  ulong uVar10;
  pointer pdVar11;
  bool bVar12;
  alignment_set_t tmp;
  alignment_set_t intersect;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_110;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> local_f0;
  undefined1 local_d0 [96];
  undefined1 local_70 [32];
  LogWriter *local_50;
  
  sVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from(R,0);
  pdVar11 = (this->vertices_->
            super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_f0.m_bits,&pdVar11[sVar3].m_bits);
  local_f0.m_num_bits = pdVar11[sVar3].m_num_bits;
  local_f0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[sVar3 >> 6] =
       local_f0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start[sVar3 >> 6] | 1L << ((byte)sVar3 & 0x3f);
  sVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next(R,sVar3);
  for (; sVar3 != 0xffffffffffffffff;
      sVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                        (R,sVar3)) {
    pdVar11 = (this->vertices_->
              super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + sVar3;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_110.m_bits,&pdVar11->m_bits);
    local_110.m_num_bits = pdVar11->m_num_bits;
    local_110.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[sVar3 >> 6] =
         local_110.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start[sVar3 >> 6] | 1L << ((byte)sVar3 & 0x3f);
    if ((long)local_f0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)local_f0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start != 0) {
      lVar6 = (long)local_f0.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_f0.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      lVar7 = 0;
      do {
        local_f0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar7] =
             local_f0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar7] &
             local_110.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
    }
    if (local_110.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (ulong *)0x0) {
      operator_delete(local_110.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  puVar1 = (R->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar6 = (long)(R->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
  bVar12 = lVar6 == 0;
  if (bVar12) {
LAB_00153c18:
    if (!bVar12) goto LAB_00153c6a;
    boost::operator|(&local_110,P,X);
    bVar12 = (long)local_110.m_bits.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_110.m_bits.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start == 0;
    if (!bVar12) {
      uVar4 = (long)local_110.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_110.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3;
      if ((*local_110.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start &
          ~*local_f0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start) == 0) {
        uVar2 = 1;
        do {
          uVar10 = uVar2;
          if (uVar4 + (uVar4 == 0) == uVar10) break;
          uVar2 = uVar10 + 1;
        } while ((local_110.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar10] &
                 ~local_f0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar10]) == 0);
        bVar12 = uVar4 <= uVar10;
      }
      else {
        bVar12 = false;
      }
    }
    if (local_110.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (ulong *)0x0) {
      operator_delete(local_110.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    bVar8 = true;
    if (bVar12) goto LAB_0015400c;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"(P | X) - intersect:",0x14);
    boost::operator|(&local_110,P,X);
    pBVar9 = (BronKerbosch *)(local_d0 + 0x40);
    boost::operator-((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)pBVar9,
                     &local_110,&local_f0);
    printSet(pBVar9,(ostream *)&std::cerr,(alignment_set_t *)(local_d0 + 0x40));
    if ((pointer)local_d0._64_8_ != (pointer)0x0) {
      operator_delete((void *)local_d0._64_8_);
    }
    if (local_110.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (ulong *)0x0) {
      operator_delete(local_110.m_bits.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"vertices in P:",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    sVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
                      (P,0);
    pBVar9 = (BronKerbosch *)(local_d0 + 0x20);
    for (; sVar3 != 0xffffffffffffffff;
        sVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                          (P,sVar3)) {
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
      pdVar11 = (this->vertices_->
                super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + sVar3;
      this_00 = pBVar9;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)pBVar9,&pdVar11->m_bits);
      local_d0._56_8_ = pdVar11->m_num_bits;
      printSet(this_00,(ostream *)&std::cerr,(alignment_set_t *)pBVar9);
      if ((clique_list_t *)local_d0._32_8_ != (clique_list_t *)0x0) {
        operator_delete((void *)local_d0._32_8_);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"vertices in X:",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    sVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
                      (X,0);
    for (; sVar3 != 0xffffffffffffffff;
        sVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                          (X,sVar3)) {
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
      pdVar11 = (this->vertices_->
                super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + sVar3;
      pBVar9 = (BronKerbosch *)local_d0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0,&pdVar11->m_bits)
      ;
      local_d0._24_8_ = pdVar11->m_num_bits;
      printSet(pBVar9,(ostream *)&std::cerr,(alignment_set_t *)local_d0);
      if ((_func_int **)local_d0._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_d0._0_8_);
      }
    }
  }
  else {
    uVar4 = lVar6 >> 3;
    if ((*puVar1 &
        ~*local_f0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start) == 0) {
      uVar2 = 1;
      do {
        uVar10 = uVar2;
        if (uVar4 + (uVar4 == 0) == uVar10) break;
        uVar2 = uVar10 + 1;
      } while ((puVar1[uVar10] &
               ~local_f0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar10]) == 0);
      bVar12 = uVar4 <= uVar10;
      goto LAB_00153c18;
    }
LAB_00153c6a:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"R - intersect:",0xe);
    pBVar9 = (BronKerbosch *)&stack0xffffffffffffffb0;
    boost::operator-((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)pBVar9,R,
                     &local_f0);
    printSet(pBVar9,(ostream *)&std::cerr,(alignment_set_t *)&stack0xffffffffffffffb0);
    if (local_50 != (LogWriter *)0x0) {
      operator_delete(local_50);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"vertices in R:",0xe);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    sVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::m_do_find_from
                      (R,0);
    for (; sVar3 != 0xffffffffffffffff;
        sVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                          (R,sVar3)) {
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
      pdVar11 = (this->vertices_->
                super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + sVar3;
      pBVar9 = (BronKerbosch *)local_70;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_70,&pdVar11->m_bits)
      ;
      local_70._24_8_ = pdVar11->m_num_bits;
      printSet(pBVar9,(ostream *)&std::cerr,(alignment_set_t *)local_70);
      if ((vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *)local_70._0_8_ !=
          (vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *)0x0) {
        operator_delete((void *)local_70._0_8_);
      }
    }
  }
  bVar8 = false;
LAB_0015400c:
  if (local_f0.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (ulong *)0x0) {
    operator_delete(local_f0.m_bits.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar8;
}

Assistant:

bool BronKerbosch::cliquesistent(const alignment_set_t& R, const alignment_set_t& P, const alignment_set_t& X) {
    auto i = R.find_first();
    alignment_set_t intersect((*vertices_)[i]);
    intersect.set(i);

    for (i=R.find_next(i); i != alignment_set_t::npos; i = R.find_next(i)) {
        alignment_set_t tmp((*vertices_)[i]);
        tmp.set(i);

        intersect &= tmp;
    }
    if (not R.is_subset_of(intersect)) {
        cerr << "R - intersect:";
        printSet(cerr, R - intersect);
        cerr << "vertices in R:" << endl;
        for (auto i=R.find_first(); i != alignment_set_t::npos; i = R.find_next(i)) {
            cerr << i << ":";
            printSet(cerr, (*vertices_)[i]);
        }
        return false;
    }
    if (not (P | X).is_subset_of(intersect)) {
        cerr << "(P | X) - intersect:";
        printSet(cerr, (P | X) - intersect);
        cerr << "vertices in P:" << endl;
        for (auto i=P.find_first(); i != alignment_set_t::npos; i = P.find_next(i)) {
            cerr << i << ":";
            printSet(cerr, (*vertices_)[i]);
        }
        cerr << "vertices in X:" << endl;
        for (auto i=X.find_first(); i != alignment_set_t::npos; i = X.find_next(i)) {
            cerr << i << ":";
            printSet(cerr, (*vertices_)[i]);
        }

        return false;
    }
    return true;
}